

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

CompilerMSL * __thiscall
spirv_cross::CompilerMSL::member_attribute_qualifier_abi_cxx11_
          (CompilerMSL *this,SPIRType *type,uint32_t index)

{
  BuiltIn BVar1;
  bool bVar2;
  uint32_t uVar3;
  TypedID *this_00;
  size_type sVar4;
  CompilerError *pCVar5;
  TypedID<(spirv_cross::Types)1> *pTVar6;
  SPIRType *pSVar7;
  ulong uVar8;
  uint in_ECX;
  undefined4 in_register_00000014;
  BuiltIn builtin_00;
  bool local_ae9;
  bool local_a42;
  allocator local_8c2;
  allocator local_8c1;
  undefined1 local_8c0 [40];
  string local_898 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_878 [35];
  allocator local_855;
  uint32_t local_854;
  uint32_t local_850;
  uint32_t local_84c;
  uint32_t local_848;
  uint32_t local_844;
  uint32_t local_840;
  allocator local_839;
  uint32_t local_838;
  allocator local_831;
  uint32_t locn_3;
  allocator local_809;
  string local_808 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7e8 [39];
  allocator local_7c1;
  undefined1 local_7c0 [40];
  string local_798 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_778 [38];
  char local_752;
  allocator local_751;
  string local_750 [39];
  allocator local_729;
  string local_728 [36];
  uint32_t local_704;
  uint32_t local_700;
  uint32_t local_6fc;
  uint32_t local_6f8;
  uint32_t local_6f4;
  uint32_t local_6f0;
  char local_6ea;
  allocator local_6e9;
  string local_6e8 [32];
  uint32_t local_6c8;
  uint32_t local_6c4;
  uint32_t local_6c0;
  uint32_t local_6bc;
  undefined1 local_6b8 [48];
  undefined1 local_688 [40];
  string quals_1;
  spirv_cross local_648 [39];
  allocator local_621;
  string local_620 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_600 [32];
  uint32_t local_5e0;
  allocator local_5d9;
  uint32_t locn_2;
  allocator local_5d2;
  allocator local_5d1;
  undefined1 local_5d0 [40];
  string local_5a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_588 [39];
  allocator local_561;
  spirv_cross local_560 [39];
  allocator local_539;
  string local_538 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_518 [32];
  uint32_t local_4f8;
  allocator local_4f2;
  allocator local_4f1;
  uint32_t locn_1;
  allocator local_4c9;
  string local_4c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_488 [39];
  allocator local_461;
  undefined1 local_460 [40];
  string local_438 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8 [34];
  allocator local_3d6;
  allocator local_3d5;
  uint local_3d4;
  undefined1 local_3d0 [8];
  string loc_qual;
  allocator local_3a9;
  undefined1 local_3a8 [40];
  string local_380 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340 [36];
  uint32_t local_31c;
  uint32_t local_318;
  uint32_t local_314;
  undefined1 local_310 [40];
  string local_2e8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8 [36];
  uint32_t local_284;
  uint32_t local_280;
  uint32_t local_27c;
  undefined1 local_278 [40];
  string local_250 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210 [38];
  char local_1ea;
  allocator local_1e9;
  string local_1e8 [36];
  byte local_1c4;
  allocator local_1c3;
  byte local_1c2;
  byte local_1c1;
  undefined1 local_1c0 [40];
  string local_198 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178 [32];
  spirv_cross local_158 [39];
  allocator local_131;
  string local_130 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110 [32];
  FunctionID local_f0;
  allocator local_eb;
  char local_ea;
  allocator local_e9;
  uint32_t locn;
  undefined1 local_c8 [40];
  string local_a0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80 [35];
  allocator local_5d [13];
  float local_50;
  uint32_t local_4c;
  char local_46;
  byte local_45;
  BuiltIn local_44;
  bool is_builtin;
  SPIRType *pSStack_40;
  BuiltIn builtin;
  SPIRType *mbr_type;
  AlignedBuffer<unsigned_char,_8UL> AStack_30;
  uint32_t mbr_type_id;
  SPIREntryPoint *execution;
  SPIRType *pSStack_20;
  uint32_t index_local;
  SPIRType *type_local;
  CompilerMSL *this_local;
  string *quals;
  
  pSStack_20 = (SPIRType *)CONCAT44(in_register_00000014,index);
  execution._4_4_ = in_ECX;
  type_local = type;
  this_local = this;
  AStack_30.aligned_char = (char  [8])Compiler::get_entry_point((Compiler *)type);
  this_00 = (TypedID *)
            VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                      (&(pSStack_20->member_types).
                        super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>,
                       (ulong)execution._4_4_);
  mbr_type._4_4_ = TypedID::operator_cast_to_unsigned_int(this_00);
  pSStack_40 = Compiler::get<spirv_cross::SPIRType>((Compiler *)type,mbr_type._4_4_);
  local_44 = BuiltInMax;
  local_45 = Compiler::is_member_builtin((Compiler *)type,pSStack_20,execution._4_4_,&local_44);
  uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSStack_20->super_IVariant).self);
  bVar2 = Compiler::has_extended_member_decoration
                    ((Compiler *)type,uVar3,execution._4_4_,SPIRVCrossDecorationResourceIndexPrimary
                    );
  BVar1 = local_44;
  if (bVar2) {
    local_46 = '\0';
    uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSStack_20->super_IVariant).self);
    local_4c = Compiler::get_extended_member_decoration
                         ((Compiler *)type,uVar3,execution._4_4_,
                          SPIRVCrossDecorationResourceIndexPrimary);
    join<char_const(&)[7],unsigned_int,char_const(&)[2]>
              ((spirv_cross *)this,(char (*) [7])" [[id(",&local_4c,(char (*) [2])0x5eaa1a);
    uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSStack_20->super_IVariant).self);
    local_50 = (float)Compiler::get_extended_member_decoration
                                ((Compiler *)type,uVar3,execution._4_4_,
                                 SPIRVCrossDecorationInterfaceOrigID);
    sVar4 = ::std::
            unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
            ::count((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                     *)&type[9].array,(key_type *)&local_50);
    if (sVar4 != 0) {
      ::std::__cxx11::string::operator+=((string *)this,", raster_order_group(0)");
    }
    ::std::__cxx11::string::operator+=((string *)this,"]]");
    return this;
  }
  builtin_00 = (BuiltIn)type;
  if ((*(ExecutionModel *)((long)AStack_30.aligned_char + 0xe8) == ExecutionModelVertex) &&
     (pSStack_20->storage == StorageClassInput)) {
    if ((local_45 & 1) != 0) {
      if (((1 < local_44 - BuiltInVertexId) && (1 < local_44 - BuiltInVertexIndex)) &&
         (1 < local_44 - BuiltInBaseVertex)) {
        if (local_44 != BuiltInDrawIndex) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)this,"",&local_eb);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_eb);
          return this;
        }
        local_ea = '\x01';
        pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&locn,"DrawIndex is not supported in MSL.",&local_e9);
        CompilerError::CompilerError(pCVar5,(string *)&locn);
        local_ea = '\0';
        __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      if (((ulong)type[0x1e].array.super_VectorView<unsigned_int>.ptr & 0x1000000000000) != 0) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)this,"",local_5d);
        ::std::allocator<char>::~allocator((allocator<char> *)local_5d);
        return this;
      }
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_a0," [[",(allocator *)(local_c8 + 0x27));
      builtin_qualifier_abi_cxx11_((CompilerMSL *)local_c8,builtin_00);
      ::std::operator+(local_80,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_a0);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                       (char *)local_80);
      ::std::__cxx11::string::~string((string *)local_80);
      ::std::__cxx11::string::~string((string *)local_c8);
      ::std::__cxx11::string::~string(local_a0);
      ::std::allocator<char>::~allocator((allocator<char> *)(local_c8 + 0x27));
      return this;
    }
    if ((local_45 & 1) == 0) {
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSStack_20->super_IVariant).self);
      local_f0.id = get_member_location((CompilerMSL *)type,uVar3,execution._4_4_,(uint32_t *)0x0);
    }
    else {
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSStack_20->super_IVariant).self);
      local_f0.id = get_or_allocate_builtin_input_member_location
                              ((CompilerMSL *)type,BVar1,uVar3,execution._4_4_,(uint32_t *)0x0);
    }
    if (local_f0.id != 0xffffffff) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_130," [[attribute(",&local_131);
      convert_to_string<unsigned_int,_0>(local_158,&local_f0.id);
      ::std::operator+(local_110,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_130);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                       (char *)local_110);
      ::std::__cxx11::string::~string((string *)local_110);
      ::std::__cxx11::string::~string((string *)local_158);
      ::std::__cxx11::string::~string(local_130);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_131);
      return this;
    }
  }
  if ((((*(ExecutionModel *)((long)AStack_30.aligned_char + 0xe8) == ExecutionModelVertex) &&
       (((ulong)type[0x1e].array.super_VectorView<unsigned_int>.ptr & 0x1000000000000) == 0)) ||
      (bVar2 = is_tese_shader((CompilerMSL *)type), bVar2)) &&
     (pSStack_20->storage == StorageClassOutput)) {
    if ((local_45 & 1) != 0) {
      switch(local_44) {
      case BuiltInPointSize:
        goto switchD_004db09b_caseD_1;
      default:
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)this,"",&local_3a9);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_3a9);
        return this;
      case BuiltInClipDistance:
        local_27c = (uint32_t)
                    TypedID::operator_cast_to_TypedID((TypedID *)&(pSStack_20->super_IVariant).self)
        ;
        bVar2 = Compiler::has_member_decoration
                          ((Compiler *)type,(TypeID)local_27c,execution._4_4_,DecorationIndex);
        if (!bVar2) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string(local_2e8," [[",(allocator *)(local_310 + 0x27));
          builtin_qualifier_abi_cxx11_((CompilerMSL *)local_310,builtin_00);
          ::std::operator+(local_2c8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_2e8);
          ::std::operator+(local_2a8,(char *)local_2c8);
          VectorView<unsigned_int>::empty(&(pSStack_40->array).super_VectorView<unsigned_int>);
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this
                           ,(char *)local_2a8);
          ::std::__cxx11::string::~string((string *)local_2a8);
          ::std::__cxx11::string::~string((string *)local_2c8);
          ::std::__cxx11::string::~string((string *)local_310);
          ::std::__cxx11::string::~string(local_2e8);
          ::std::allocator<char>::~allocator((allocator<char> *)(local_310 + 0x27));
          return this;
        }
        local_284 = (uint32_t)
                    TypedID::operator_cast_to_TypedID((TypedID *)&(pSStack_20->super_IVariant).self)
        ;
        local_280 = Compiler::get_member_decoration
                              ((Compiler *)type,(TypeID)local_284,execution._4_4_,DecorationIndex);
        join<char_const(&)[13],unsigned_int,char_const(&)[4]>
                  ((spirv_cross *)this,(char (*) [13])" [[user(clip",&local_280,(char (*) [4])")]]")
        ;
        return this;
      case BuiltInCullDistance:
        local_314 = (uint32_t)
                    TypedID::operator_cast_to_TypedID((TypedID *)&(pSStack_20->super_IVariant).self)
        ;
        bVar2 = Compiler::has_member_decoration
                          ((Compiler *)type,(TypeID)local_314,execution._4_4_,DecorationIndex);
        if (!bVar2) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string(local_380," [[",(allocator *)(local_3a8 + 0x27));
          builtin_qualifier_abi_cxx11_((CompilerMSL *)local_3a8,builtin_00);
          ::std::operator+(local_360,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_380);
          ::std::operator+(local_340,(char *)local_360);
          VectorView<unsigned_int>::empty(&(pSStack_40->array).super_VectorView<unsigned_int>);
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this
                           ,(char *)local_340);
          ::std::__cxx11::string::~string((string *)local_340);
          ::std::__cxx11::string::~string((string *)local_360);
          ::std::__cxx11::string::~string((string *)local_3a8);
          ::std::__cxx11::string::~string(local_380);
          ::std::allocator<char>::~allocator((allocator<char> *)(local_3a8 + 0x27));
          return this;
        }
        local_31c = (uint32_t)
                    TypedID::operator_cast_to_TypedID((TypedID *)&(pSStack_20->super_IVariant).self)
        ;
        local_318 = Compiler::get_member_decoration
                              ((Compiler *)type,(TypeID)local_31c,execution._4_4_,DecorationIndex);
        join<char_const(&)[13],unsigned_int,char_const(&)[4]>
                  ((spirv_cross *)this,(char (*) [13])" [[user(cull",&local_318,(char (*) [4])")]]")
        ;
        return this;
      case BuiltInViewportIndex:
        bVar2 = Options::supports_msl_version((Options *)&type[0x1d].image.sampled,2,0,0);
        if (!bVar2) {
          local_1ea = '\x01';
          pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string(local_1e8,"ViewportIndex requires Metal 2.0.",&local_1e9);
          CompilerError::CompilerError(pCVar5,(string *)local_1e8);
          local_1ea = '\0';
          __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
      case BuiltInPosition:
      case BuiltInLayer:
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_250," [[",(allocator *)(local_278 + 0x27));
        builtin_qualifier_abi_cxx11_((CompilerMSL *)local_278,builtin_00);
        ::std::operator+(local_230,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_250);
        ::std::operator+(local_210,(char *)local_230);
        VectorView<unsigned_int>::empty(&(pSStack_40->array).super_VectorView<unsigned_int>);
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                         (char *)local_210);
        ::std::__cxx11::string::~string((string *)local_210);
        ::std::__cxx11::string::~string((string *)local_230);
        ::std::__cxx11::string::~string((string *)local_278);
        ::std::__cxx11::string::~string(local_250);
        ::std::allocator<char>::~allocator((allocator<char> *)(local_278 + 0x27));
        return this;
      }
    }
    member_location_attribute_qualifier_abi_cxx11_
              ((CompilerMSL *)local_3d0,type,(uint32_t)pSStack_20);
    uVar8 = ::std::__cxx11::string::empty();
    bVar2 = (uVar8 & 1) == 0;
    if (bVar2) {
      join<char_const(&)[4],std::__cxx11::string&,char_const(&)[3]>
                ((spirv_cross *)this,(char (*) [4])" [[",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3d0,
                 (char (*) [3])0x5fec56);
    }
    local_3d4 = (uint)bVar2;
    ::std::__cxx11::string::~string((string *)local_3d0);
    if (local_3d4 != 0) {
      return this;
    }
  }
  BVar1 = local_44;
  if (((*(ExecutionModel *)((long)AStack_30.aligned_char + 0xe8) == ExecutionModelVertex) &&
      (((ulong)type[0x1e].array.super_VectorView<unsigned_int>.ptr & 0x1000000000000) != 0)) &&
     (pSStack_20->storage == StorageClassOutput)) {
    if ((local_45 & 1) != 0) {
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSStack_20->super_IVariant).self);
      get_or_allocate_builtin_output_member_location
                ((CompilerMSL *)type,BVar1,uVar3,execution._4_4_,(uint32_t *)0x0);
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"",&local_3d5);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_3d5);
    return this;
  }
  bVar2 = is_tesc_shader((CompilerMSL *)type);
  BVar1 = local_44;
  if ((bVar2) && (pSStack_20->storage == StorageClassInput)) {
    if ((local_45 & 1) != 0) {
      switch(local_44) {
      case BuiltInPrimitiveId:
      case BuiltInInvocationId:
        if (((ulong)type[0x1e].array.super_VectorView<unsigned_int>.ptr & 0x100000000) != 0) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)this,"",&local_3d6);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_3d6);
          return this;
        }
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_438," [[",(allocator *)(local_460 + 0x27));
        builtin_qualifier_abi_cxx11_((CompilerMSL *)local_460,builtin_00);
        ::std::operator+(local_418,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_438);
        ::std::operator+(local_3f8,(char *)local_418);
        VectorView<unsigned_int>::empty(&(pSStack_40->array).super_VectorView<unsigned_int>);
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                         (char *)local_3f8);
        ::std::__cxx11::string::~string((string *)local_3f8);
        ::std::__cxx11::string::~string((string *)local_418);
        ::std::__cxx11::string::~string((string *)local_460);
        ::std::__cxx11::string::~string(local_438);
        ::std::allocator<char>::~allocator((allocator<char> *)(local_460 + 0x27));
        return this;
      default:
        break;
      case BuiltInPatchVertices:
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)this,"",&local_4f1);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_4f1);
        return this;
      case BuiltInSubgroupSize:
      case BuiltInSubgroupLocalInvocationId:
        if ((type[0x1e].array.super_VectorView<unsigned_int>.buffer_size & 0x100) != 0) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)this,"",&local_461);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_461);
          return this;
        }
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_4c8," [[",&local_4c9);
        builtin_qualifier_abi_cxx11_((CompilerMSL *)&locn_1,builtin_00);
        ::std::operator+(local_4a8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_4c8);
        ::std::operator+(local_488,(char *)local_4a8);
        VectorView<unsigned_int>::empty(&(pSStack_40->array).super_VectorView<unsigned_int>);
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                         (char *)local_488);
        ::std::__cxx11::string::~string((string *)local_488);
        ::std::__cxx11::string::~string((string *)local_4a8);
        ::std::__cxx11::string::~string((string *)&locn_1);
        ::std::__cxx11::string::~string(local_4c8);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_4c9);
        return this;
      }
    }
    if (((ulong)type[0x1e].array.super_VectorView<unsigned_int>.ptr & 0x100000000) != 0) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)this,"",&local_4f2);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_4f2);
      return this;
    }
    if ((local_45 & 1) == 0) {
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSStack_20->super_IVariant).self);
      local_4f8 = get_member_location((CompilerMSL *)type,uVar3,execution._4_4_,(uint32_t *)0x0);
    }
    else {
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSStack_20->super_IVariant).self);
      local_4f8 = get_or_allocate_builtin_input_member_location
                            ((CompilerMSL *)type,BVar1,uVar3,execution._4_4_,(uint32_t *)0x0);
    }
    if (local_4f8 != 0xffffffff) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_538," [[attribute(",&local_539);
      convert_to_string<unsigned_int,_0>(local_560,&local_4f8);
      ::std::operator+(local_518,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_538);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                       (char *)local_518);
      ::std::__cxx11::string::~string((string *)local_518);
      ::std::__cxx11::string::~string((string *)local_560);
      ::std::__cxx11::string::~string(local_538);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_539);
      return this;
    }
  }
  bVar2 = is_tesc_shader((CompilerMSL *)type);
  BVar1 = local_44;
  if ((bVar2) && (pSStack_20->storage == StorageClassOutput)) {
    if ((local_45 & 1) != 0) {
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSStack_20->super_IVariant).self);
      get_or_allocate_builtin_output_member_location
                ((CompilerMSL *)type,BVar1,uVar3,execution._4_4_,(uint32_t *)0x0);
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"",&local_561);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_561);
    return this;
  }
  bVar2 = is_tese_shader((CompilerMSL *)type);
  if ((bVar2) && (pSStack_20->storage == StorageClassInput)) {
    if ((local_45 & 1) != 0) {
      if ((local_44 == BuiltInPrimitiveId) || (local_44 == BuiltInTessCoord)) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_5a8," [[",(allocator *)(local_5d0 + 0x27));
        builtin_qualifier_abi_cxx11_((CompilerMSL *)local_5d0,builtin_00);
        ::std::operator+(local_588,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_5a8);
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                         (char *)local_588);
        ::std::__cxx11::string::~string((string *)local_588);
        ::std::__cxx11::string::~string((string *)local_5d0);
        ::std::__cxx11::string::~string(local_5a8);
        ::std::allocator<char>::~allocator((allocator<char> *)(local_5d0 + 0x27));
        return this;
      }
      if (local_44 == BuiltInPatchVertices) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)this,"",&local_5d1);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_5d1);
        return this;
      }
    }
    if (((ulong)type[0x1e].array.super_VectorView<unsigned_int>.ptr & 0x10000000000) != 0) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)this,"",&local_5d2);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_5d2);
      return this;
    }
    pTVar6 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                       (&(pSStack_20->member_types).
                         super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>,
                        (ulong)execution._4_4_);
    locn_2 = pTVar6->id;
    pSVar7 = Compiler::get_type((Compiler *)type,(TypeID)locn_2);
    BVar1 = local_44;
    if (*(int *)&(pSVar7->super_IVariant).field_0xc == 0x15) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)this,"",&local_5d9);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_5d9);
      return this;
    }
    if ((local_45 & 1) == 0) {
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSStack_20->super_IVariant).self);
      local_5e0 = get_member_location((CompilerMSL *)type,uVar3,execution._4_4_,(uint32_t *)0x0);
    }
    else {
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSStack_20->super_IVariant).self);
      local_5e0 = get_or_allocate_builtin_input_member_location
                            ((CompilerMSL *)type,BVar1,uVar3,execution._4_4_,(uint32_t *)0x0);
    }
    if (local_5e0 != 0xffffffff) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_620," [[attribute(",&local_621);
      convert_to_string<unsigned_int,_0>(local_648,&local_5e0);
      ::std::operator+(local_600,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_620);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                       (char *)local_600);
      ::std::__cxx11::string::~string((string *)local_600);
      ::std::__cxx11::string::~string((string *)local_648);
      ::std::__cxx11::string::~string(local_620);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_621);
      return this;
    }
  }
  if ((*(ExecutionModel *)((long)AStack_30.aligned_char + 0xe8) == ExecutionModelFragment) &&
     (pSStack_20->storage == StorageClassInput)) {
    ::std::__cxx11::string::string((string *)(local_688 + 0x20));
    if ((local_45 & 1) == 0) {
      member_location_attribute_qualifier_abi_cxx11_
                ((CompilerMSL *)local_6b8,type,(uint32_t)pSStack_20);
      ::std::__cxx11::string::operator=((string *)(local_688 + 0x20),(string *)local_6b8);
      ::std::__cxx11::string::~string((string *)local_6b8);
      goto LAB_004dc957;
    }
    if (local_44 == BuiltInClipDistance) {
      local_6b8._40_4_ =
           TypedID::operator_cast_to_TypedID((TypedID *)&(pSStack_20->super_IVariant).self);
      local_6b8._44_4_ =
           Compiler::get_member_decoration
                     ((Compiler *)type,(TypeID)local_6b8._40_4_,execution._4_4_,DecorationIndex);
      join<char_const(&)[13],unsigned_int,char_const(&)[4]>
                ((spirv_cross *)this,(char (*) [13])" [[user(clip",(uint *)(local_6b8 + 0x2c),
                 (char (*) [4])")]]");
      local_3d4 = 1;
    }
    else if (local_44 == BuiltInCullDistance) {
      local_6b8._32_4_ =
           TypedID::operator_cast_to_TypedID((TypedID *)&(pSStack_20->super_IVariant).self);
      local_6b8._36_4_ =
           Compiler::get_member_decoration
                     ((Compiler *)type,(TypeID)local_6b8._32_4_,execution._4_4_,DecorationIndex);
      join<char_const(&)[13],unsigned_int,char_const(&)[4]>
                ((spirv_cross *)this,(char (*) [13])" [[user(cull",(uint *)(local_6b8 + 0x24),
                 (char (*) [4])")]]");
      local_3d4 = 1;
    }
    else {
      if (((local_44 == BuiltInLayer) || (local_44 - BuiltInFragCoord < 4)) ||
         (local_44 == BuiltInSampleMask)) {
LAB_004dc7c9:
        builtin_qualifier_abi_cxx11_((CompilerMSL *)local_688,builtin_00);
        ::std::__cxx11::string::operator=((string *)(local_688 + 0x20),(string *)local_688);
        ::std::__cxx11::string::~string((string *)local_688);
      }
      else if (local_44 == BuiltInViewIndex) {
        if (((type[0x1e].super_IVariant.self.id & 0x1000000) != 0) &&
           ((type[0x1e].super_IVariant.field_0xc & 1) != 0)) goto LAB_004dc7c9;
      }
      else if (local_44 - BuiltInBaryCoordKHR < 2) goto LAB_004dc7c9;
LAB_004dc957:
      if ((local_44 == BuiltInBaryCoordKHR) || (local_44 == BuiltInBaryCoordNoPerspKHR)) {
        local_6bc = (uint32_t)
                    TypedID::operator_cast_to_TypedID((TypedID *)&(pSStack_20->super_IVariant).self)
        ;
        bVar2 = Compiler::has_member_decoration
                          ((Compiler *)type,(TypeID)local_6bc,execution._4_4_,DecorationFlat);
        local_a42 = true;
        if (!bVar2) {
          local_6c0 = (uint32_t)
                      TypedID::operator_cast_to_TypedID
                                ((TypedID *)&(pSStack_20->super_IVariant).self);
          bVar2 = Compiler::has_member_decoration
                            ((Compiler *)type,(TypeID)local_6c0,execution._4_4_,DecorationCentroid);
          local_a42 = true;
          if (!bVar2) {
            local_6c4 = (uint32_t)
                        TypedID::operator_cast_to_TypedID
                                  ((TypedID *)&(pSStack_20->super_IVariant).self);
            bVar2 = Compiler::has_member_decoration
                              ((Compiler *)type,(TypeID)local_6c4,execution._4_4_,DecorationSample);
            local_a42 = true;
            if (!bVar2) {
              local_6c8 = (uint32_t)
                          TypedID::operator_cast_to_TypedID
                                    ((TypedID *)&(pSStack_20->super_IVariant).self);
              local_a42 = Compiler::has_member_decoration
                                    ((Compiler *)type,(TypeID)local_6c8,execution._4_4_,
                                     DecorationNoPerspective);
            }
          }
        }
        if (local_a42 != false) {
          local_6ea = '\x01';
          pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_6e8,
                     "Flat, Centroid, Sample, NoPerspective decorations are not supported for BaryCoord inputs."
                     ,&local_6e9);
          CompilerError::CompilerError(pCVar5,(string *)local_6e8);
          local_6ea = '\0';
          __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
      }
      bVar2 = type_is_integral(pSStack_40);
      if ((!bVar2) && (((local_45 & 1) == 0 || (local_44 != BuiltInFragCoord)))) {
        local_6f0 = (uint32_t)
                    TypedID::operator_cast_to_TypedID((TypedID *)&(pSStack_20->super_IVariant).self)
        ;
        bVar2 = Compiler::has_member_decoration
                          ((Compiler *)type,(TypeID)local_6f0,execution._4_4_,DecorationFlat);
        if (bVar2) {
          uVar8 = ::std::__cxx11::string::empty();
          if ((uVar8 & 1) == 0) {
            ::std::__cxx11::string::operator+=((string *)(local_688 + 0x20),", ");
          }
          ::std::__cxx11::string::operator+=((string *)(local_688 + 0x20),"flat");
        }
        else {
          local_6f4 = (uint32_t)
                      TypedID::operator_cast_to_TypedID
                                ((TypedID *)&(pSStack_20->super_IVariant).self);
          bVar2 = Compiler::has_member_decoration
                            ((Compiler *)type,(TypeID)local_6f4,execution._4_4_,DecorationCentroid);
          if (bVar2) {
            uVar8 = ::std::__cxx11::string::empty();
            if ((uVar8 & 1) == 0) {
              ::std::__cxx11::string::operator+=((string *)(local_688 + 0x20),", ");
            }
            local_6f8 = (uint32_t)
                        TypedID::operator_cast_to_TypedID
                                  ((TypedID *)&(pSStack_20->super_IVariant).self);
            bVar2 = Compiler::has_member_decoration
                              ((Compiler *)type,(TypeID)local_6f8,execution._4_4_,
                               DecorationNoPerspective);
            if (bVar2) {
              ::std::__cxx11::string::operator+=
                        ((string *)(local_688 + 0x20),"centroid_no_perspective");
            }
            else {
              ::std::__cxx11::string::operator+=
                        ((string *)(local_688 + 0x20),"centroid_perspective");
            }
          }
          else {
            local_6fc = (uint32_t)
                        TypedID::operator_cast_to_TypedID
                                  ((TypedID *)&(pSStack_20->super_IVariant).self);
            bVar2 = Compiler::has_member_decoration
                              ((Compiler *)type,(TypeID)local_6fc,execution._4_4_,DecorationSample);
            if (bVar2) {
              uVar8 = ::std::__cxx11::string::empty();
              if ((uVar8 & 1) == 0) {
                ::std::__cxx11::string::operator+=((string *)(local_688 + 0x20),", ");
              }
              local_700 = (uint32_t)
                          TypedID::operator_cast_to_TypedID
                                    ((TypedID *)&(pSStack_20->super_IVariant).self);
              bVar2 = Compiler::has_member_decoration
                                ((Compiler *)type,(TypeID)local_700,execution._4_4_,
                                 DecorationNoPerspective);
              if (bVar2) {
                ::std::__cxx11::string::operator+=
                          ((string *)(local_688 + 0x20),"sample_no_perspective");
              }
              else {
                ::std::__cxx11::string::operator+=
                          ((string *)(local_688 + 0x20),"sample_perspective");
              }
            }
            else {
              local_704 = (uint32_t)
                          TypedID::operator_cast_to_TypedID
                                    ((TypedID *)&(pSStack_20->super_IVariant).self);
              bVar2 = Compiler::has_member_decoration
                                ((Compiler *)type,(TypeID)local_704,execution._4_4_,
                                 DecorationNoPerspective);
              if (bVar2) {
                uVar8 = ::std::__cxx11::string::empty();
                if ((uVar8 & 1) == 0) {
                  ::std::__cxx11::string::operator+=((string *)(local_688 + 0x20),", ");
                }
                ::std::__cxx11::string::operator+=
                          ((string *)(local_688 + 0x20),"center_no_perspective");
              }
            }
          }
        }
      }
      uVar8 = ::std::__cxx11::string::empty();
      if ((uVar8 & 1) == 0) {
        ::std::operator+((char *)local_728,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" [[")
        ;
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                         (char *)local_728);
        ::std::__cxx11::string::~string(local_728);
        local_3d4 = 1;
      }
      else {
        local_3d4 = 0;
      }
    }
    ::std::__cxx11::string::~string((string *)(local_688 + 0x20));
    if (local_3d4 != 0) {
      return this;
    }
  }
  if ((*(ExecutionModel *)((long)AStack_30.aligned_char + 0xe8) == ExecutionModelFragment) &&
     (pSStack_20->storage == StorageClassOutput)) {
    if ((local_45 & 1) != 0) {
      if (local_44 != BuiltInSampleMask) {
        if (local_44 != BuiltInFragDepth) {
          if (local_44 != BuiltInFragStencilRefEXT) {
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string((string *)this,"",&local_831);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_831);
            return this;
          }
          if (((ulong)type[0x1e].super_IVariant._vptr_IVariant & 0x1000000000000) == 0) {
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string((string *)this,"",&local_729);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_729);
            return this;
          }
          bVar2 = Options::supports_msl_version((Options *)&type[0x1d].image.sampled,2,1,0);
          if (bVar2) {
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string(local_798," [[",(allocator *)(local_7c0 + 0x27));
            builtin_qualifier_abi_cxx11_((CompilerMSL *)local_7c0,builtin_00);
            ::std::operator+(local_778,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_798);
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             this,(char *)local_778);
            ::std::__cxx11::string::~string((string *)local_778);
            ::std::__cxx11::string::~string((string *)local_7c0);
            ::std::__cxx11::string::~string(local_798);
            ::std::allocator<char>::~allocator((allocator<char> *)(local_7c0 + 0x27));
            return this;
          }
          local_752 = '\x01';
          pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_750,"Stencil export only supported in MSL 2.1 and up.",&local_751);
          CompilerError::CompilerError(pCVar5,(string *)local_750);
          local_752 = '\0';
          __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
        if (((ulong)type[0x1e].super_IVariant._vptr_IVariant & 0x10000000000) == 0) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)this,"",&local_7c1);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_7c1);
          return this;
        }
      }
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_808," [[",&local_809);
      builtin_qualifier_abi_cxx11_((CompilerMSL *)&locn_3,builtin_00);
      ::std::operator+(local_7e8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_808);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                       (char *)local_7e8);
      ::std::__cxx11::string::~string((string *)local_7e8);
      ::std::__cxx11::string::~string((string *)&locn_3);
      ::std::__cxx11::string::~string(local_808);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_809);
      return this;
    }
    uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSStack_20->super_IVariant).self);
    local_838 = get_member_location((CompilerMSL *)type,uVar3,execution._4_4_,(uint32_t *)0x0);
    if ((local_838 != 0xffffffff) &&
       ((*(uint *)((long)&type[0x1d].member_name_cache._M_h._M_single_bucket + 4) &
        1 << ((byte)local_838 & 0x1f)) == 0)) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)this,"",&local_839);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_839);
      return this;
    }
    local_ae9 = false;
    if (local_838 != 0xffffffff) {
      local_840 = (uint32_t)
                  TypedID::operator_cast_to_TypedID((TypedID *)&(pSStack_20->super_IVariant).self);
      local_ae9 = Compiler::has_member_decoration
                            ((Compiler *)type,(TypeID)local_840,execution._4_4_,DecorationIndex);
    }
    if (local_ae9 == false) {
      if (local_838 != 0xffffffff) {
        join<char_const(&)[10],unsigned_int&,char_const(&)[4]>
                  ((spirv_cross *)this,(char (*) [10])" [[color(",&local_838,(char (*) [4])")]]");
        return this;
      }
      local_84c = (uint32_t)
                  TypedID::operator_cast_to_TypedID((TypedID *)&(pSStack_20->super_IVariant).self);
      bVar2 = Compiler::has_member_decoration
                        ((Compiler *)type,(TypeID)local_84c,execution._4_4_,DecorationIndex);
      if (!bVar2) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)this,"",&local_855);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_855);
        return this;
      }
      local_854 = (uint32_t)
                  TypedID::operator_cast_to_TypedID((TypedID *)&(pSStack_20->super_IVariant).self);
      local_850 = Compiler::get_member_decoration
                            ((Compiler *)type,(TypeID)local_854,execution._4_4_,DecorationIndex);
      join<char_const(&)[10],unsigned_int,char_const(&)[4]>
                ((spirv_cross *)this,(char (*) [10])" [[index(",&local_850,(char (*) [4])")]]");
      return this;
    }
    local_848 = (uint32_t)
                TypedID::operator_cast_to_TypedID((TypedID *)&(pSStack_20->super_IVariant).self);
    local_844 = Compiler::get_member_decoration
                          ((Compiler *)type,(TypeID)local_848,execution._4_4_,DecorationIndex);
    join<char_const(&)[10],unsigned_int&,char_const(&)[10],unsigned_int,char_const(&)[4]>
              ((spirv_cross *)this,(char (*) [10])" [[color(",&local_838,(char (*) [10])"), index(",
               &local_844,(char (*) [4])")]]");
    return this;
  }
  if (((*(ExecutionModel *)((long)AStack_30.aligned_char + 0xe8) == ExecutionModelGLCompute) &&
      (pSStack_20->storage == StorageClassInput)) && ((local_45 & 1) != 0)) {
    if ((local_44 != BuiltInNumWorkgroups) && (3 < local_44 - BuiltInWorkgroupId)) {
      if ((local_44 != BuiltInSubgroupSize) &&
         ((local_44 != BuiltInNumSubgroups &&
          (local_44 != BuiltInSubgroupId && local_44 != BuiltInSubgroupLocalInvocationId)))) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)this,"",&local_8c1);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_8c1);
        return this;
      }
      if ((type[0x1e].array.super_VectorView<unsigned_int>.buffer_size & 0x100) != 0)
      goto LAB_004dd910;
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_898," [[",(allocator *)(local_8c0 + 0x27));
    builtin_qualifier_abi_cxx11_((CompilerMSL *)local_8c0,builtin_00);
    ::std::operator+(local_878,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_898)
    ;
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                     (char *)local_878);
    ::std::__cxx11::string::~string((string *)local_878);
    ::std::__cxx11::string::~string((string *)local_8c0);
    ::std::__cxx11::string::~string(local_898);
    ::std::allocator<char>::~allocator((allocator<char> *)(local_8c0 + 0x27));
  }
  else {
LAB_004dd910:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)this,"",&local_8c2);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_8c2);
  }
  return this;
switchD_004db09b_caseD_1:
  local_1c0[0x26] = 0;
  local_1c0[0x25] = 0;
  local_1c1 = 0;
  local_1c2 = 0;
  local_1c4 = 0;
  if (((ulong)type[0x1e].super_IVariant._vptr_IVariant & 0x100000000) == 0) {
    ::std::allocator<char>::allocator();
    local_1c4 = 1;
    ::std::__cxx11::string::string((string *)this,"",&local_1c3);
  }
  else {
    ::std::allocator<char>::allocator();
    local_1c0[0x26] = 1;
    ::std::__cxx11::string::string(local_198," [[",(allocator *)(local_1c0 + 0x27));
    local_1c0[0x25] = 1;
    builtin_qualifier_abi_cxx11_((CompilerMSL *)local_1c0,builtin_00);
    local_1c1 = 1;
    ::std::operator+(local_178,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198)
    ;
    local_1c2 = 1;
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                     (char *)local_178);
  }
  if ((local_1c4 & 1) != 0) {
    ::std::allocator<char>::~allocator((allocator<char> *)&local_1c3);
  }
  if ((local_1c2 & 1) != 0) {
    ::std::__cxx11::string::~string((string *)local_178);
  }
  if ((local_1c1 & 1) != 0) {
    ::std::__cxx11::string::~string((string *)local_1c0);
  }
  if ((local_1c0[0x25] & 1) != 0) {
    ::std::__cxx11::string::~string(local_198);
  }
  if ((local_1c0[0x26] & 1) == 0) {
    return this;
  }
  ::std::allocator<char>::~allocator((allocator<char> *)(local_1c0 + 0x27));
  return this;
}

Assistant:

string CompilerMSL::member_attribute_qualifier(const SPIRType &type, uint32_t index)
{
	auto &execution = get_entry_point();

	uint32_t mbr_type_id = type.member_types[index];
	auto &mbr_type = get<SPIRType>(mbr_type_id);

	BuiltIn builtin = BuiltInMax;
	bool is_builtin = is_member_builtin(type, index, &builtin);

	if (has_extended_member_decoration(type.self, index, SPIRVCrossDecorationResourceIndexPrimary))
	{
		string quals = join(
		    " [[id(", get_extended_member_decoration(type.self, index, SPIRVCrossDecorationResourceIndexPrimary), ")");
		if (interlocked_resources.count(
		        get_extended_member_decoration(type.self, index, SPIRVCrossDecorationInterfaceOrigID)))
			quals += ", raster_order_group(0)";
		quals += "]]";
		return quals;
	}

	// Vertex function inputs
	if (execution.model == ExecutionModelVertex && type.storage == StorageClassInput)
	{
		if (is_builtin)
		{
			switch (builtin)
			{
			case BuiltInVertexId:
			case BuiltInVertexIndex:
			case BuiltInBaseVertex:
			case BuiltInInstanceId:
			case BuiltInInstanceIndex:
			case BuiltInBaseInstance:
				if (msl_options.vertex_for_tessellation)
					return "";
				return string(" [[") + builtin_qualifier(builtin) + "]]";

			case BuiltInDrawIndex:
				SPIRV_CROSS_THROW("DrawIndex is not supported in MSL.");

			default:
				return "";
			}
		}

		uint32_t locn;
		if (is_builtin)
			locn = get_or_allocate_builtin_input_member_location(builtin, type.self, index);
		else
			locn = get_member_location(type.self, index);

		if (locn != k_unknown_location)
			return string(" [[attribute(") + convert_to_string(locn) + ")]]";
	}

	// Vertex and tessellation evaluation function outputs
	if (((execution.model == ExecutionModelVertex && !msl_options.vertex_for_tessellation) || is_tese_shader()) &&
	    type.storage == StorageClassOutput)
	{
		if (is_builtin)
		{
			switch (builtin)
			{
			case BuiltInPointSize:
				// Only mark the PointSize builtin if really rendering points.
				// Some shaders may include a PointSize builtin even when used to render
				// non-point topologies, and Metal will reject this builtin when compiling
				// the shader into a render pipeline that uses a non-point topology.
				return msl_options.enable_point_size_builtin ? (string(" [[") + builtin_qualifier(builtin) + "]]") : "";

			case BuiltInViewportIndex:
				if (!msl_options.supports_msl_version(2, 0))
					SPIRV_CROSS_THROW("ViewportIndex requires Metal 2.0.");
				/* fallthrough */
			case BuiltInPosition:
			case BuiltInLayer:
				return string(" [[") + builtin_qualifier(builtin) + "]]" + (mbr_type.array.empty() ? "" : " ");

			case BuiltInClipDistance:
				if (has_member_decoration(type.self, index, DecorationIndex))
					return join(" [[user(clip", get_member_decoration(type.self, index, DecorationIndex), ")]]");
				else
					return string(" [[") + builtin_qualifier(builtin) + "]]" + (mbr_type.array.empty() ? "" : " ");

			case BuiltInCullDistance:
				if (has_member_decoration(type.self, index, DecorationIndex))
					return join(" [[user(cull", get_member_decoration(type.self, index, DecorationIndex), ")]]");
				else
					return string(" [[") + builtin_qualifier(builtin) + "]]" + (mbr_type.array.empty() ? "" : " ");

			default:
				return "";
			}
		}
		string loc_qual = member_location_attribute_qualifier(type, index);
		if (!loc_qual.empty())
			return join(" [[", loc_qual, "]]");
	}

	if (execution.model == ExecutionModelVertex && msl_options.vertex_for_tessellation && type.storage == StorageClassOutput)
	{
		// For this type of shader, we always arrange for it to capture its
		// output to a buffer. For this reason, qualifiers are irrelevant here.
		if (is_builtin)
			// We still have to assign a location so the output struct will sort correctly.
			get_or_allocate_builtin_output_member_location(builtin, type.self, index);
		return "";
	}

	// Tessellation control function inputs
	if (is_tesc_shader() && type.storage == StorageClassInput)
	{
		if (is_builtin)
		{
			switch (builtin)
			{
			case BuiltInInvocationId:
			case BuiltInPrimitiveId:
				if (msl_options.multi_patch_workgroup)
					return "";
				return string(" [[") + builtin_qualifier(builtin) + "]]" + (mbr_type.array.empty() ? "" : " ");
			case BuiltInSubgroupLocalInvocationId: // FIXME: Should work in any stage
			case BuiltInSubgroupSize: // FIXME: Should work in any stage
				if (msl_options.emulate_subgroups)
					return "";
				return string(" [[") + builtin_qualifier(builtin) + "]]" + (mbr_type.array.empty() ? "" : " ");
			case BuiltInPatchVertices:
				return "";
			// Others come from stage input.
			default:
				break;
			}
		}
		if (msl_options.multi_patch_workgroup)
			return "";

		uint32_t locn;
		if (is_builtin)
			locn = get_or_allocate_builtin_input_member_location(builtin, type.self, index);
		else
			locn = get_member_location(type.self, index);

		if (locn != k_unknown_location)
			return string(" [[attribute(") + convert_to_string(locn) + ")]]";
	}

	// Tessellation control function outputs
	if (is_tesc_shader() && type.storage == StorageClassOutput)
	{
		// For this type of shader, we always arrange for it to capture its
		// output to a buffer. For this reason, qualifiers are irrelevant here.
		if (is_builtin)
			// We still have to assign a location so the output struct will sort correctly.
			get_or_allocate_builtin_output_member_location(builtin, type.self, index);
		return "";
	}

	// Tessellation evaluation function inputs
	if (is_tese_shader() && type.storage == StorageClassInput)
	{
		if (is_builtin)
		{
			switch (builtin)
			{
			case BuiltInPrimitiveId:
			case BuiltInTessCoord:
				return string(" [[") + builtin_qualifier(builtin) + "]]";
			case BuiltInPatchVertices:
				return "";
			// Others come from stage input.
			default:
				break;
			}
		}

		if (msl_options.raw_buffer_tese_input)
			return "";

		// The special control point array must not be marked with an attribute.
		if (get_type(type.member_types[index]).basetype == SPIRType::ControlPointArray)
			return "";

		uint32_t locn;
		if (is_builtin)
			locn = get_or_allocate_builtin_input_member_location(builtin, type.self, index);
		else
			locn = get_member_location(type.self, index);

		if (locn != k_unknown_location)
			return string(" [[attribute(") + convert_to_string(locn) + ")]]";
	}

	// Tessellation evaluation function outputs were handled above.

	// Fragment function inputs
	if (execution.model == ExecutionModelFragment && type.storage == StorageClassInput)
	{
		string quals;
		if (is_builtin)
		{
			switch (builtin)
			{
			case BuiltInViewIndex:
				if (!msl_options.multiview || !msl_options.multiview_layered_rendering)
					break;
				/* fallthrough */
			case BuiltInFrontFacing:
			case BuiltInPointCoord:
			case BuiltInFragCoord:
			case BuiltInSampleId:
			case BuiltInSampleMask:
			case BuiltInLayer:
			case BuiltInBaryCoordKHR:
			case BuiltInBaryCoordNoPerspKHR:
				quals = builtin_qualifier(builtin);
				break;

			case BuiltInClipDistance:
				return join(" [[user(clip", get_member_decoration(type.self, index, DecorationIndex), ")]]");
			case BuiltInCullDistance:
				return join(" [[user(cull", get_member_decoration(type.self, index, DecorationIndex), ")]]");

			default:
				break;
			}
		}
		else
			quals = member_location_attribute_qualifier(type, index);

		if (builtin == BuiltInBaryCoordKHR || builtin == BuiltInBaryCoordNoPerspKHR)
		{
			if (has_member_decoration(type.self, index, DecorationFlat) ||
			    has_member_decoration(type.self, index, DecorationCentroid) ||
			    has_member_decoration(type.self, index, DecorationSample) ||
			    has_member_decoration(type.self, index, DecorationNoPerspective))
			{
				// NoPerspective is baked into the builtin type.
				SPIRV_CROSS_THROW(
				    "Flat, Centroid, Sample, NoPerspective decorations are not supported for BaryCoord inputs.");
			}
		}

		// Don't bother decorating integers with the 'flat' attribute; it's
		// the default (in fact, the only option). Also don't bother with the
		// FragCoord builtin; it's always noperspective on Metal.
		if (!type_is_integral(mbr_type) && (!is_builtin || builtin != BuiltInFragCoord))
		{
			if (has_member_decoration(type.self, index, DecorationFlat))
			{
				if (!quals.empty())
					quals += ", ";
				quals += "flat";
			}
			else if (has_member_decoration(type.self, index, DecorationCentroid))
			{
				if (!quals.empty())
					quals += ", ";
				if (has_member_decoration(type.self, index, DecorationNoPerspective))
					quals += "centroid_no_perspective";
				else
					quals += "centroid_perspective";
			}
			else if (has_member_decoration(type.self, index, DecorationSample))
			{
				if (!quals.empty())
					quals += ", ";
				if (has_member_decoration(type.self, index, DecorationNoPerspective))
					quals += "sample_no_perspective";
				else
					quals += "sample_perspective";
			}
			else if (has_member_decoration(type.self, index, DecorationNoPerspective))
			{
				if (!quals.empty())
					quals += ", ";
				quals += "center_no_perspective";
			}
		}

		if (!quals.empty())
			return " [[" + quals + "]]";
	}

	// Fragment function outputs
	if (execution.model == ExecutionModelFragment && type.storage == StorageClassOutput)
	{
		if (is_builtin)
		{
			switch (builtin)
			{
			case BuiltInFragStencilRefEXT:
				// Similar to PointSize, only mark FragStencilRef if there's a stencil buffer.
				// Some shaders may include a FragStencilRef builtin even when used to render
				// without a stencil attachment, and Metal will reject this builtin
				// when compiling the shader into a render pipeline that does not set
				// stencilAttachmentPixelFormat.
				if (!msl_options.enable_frag_stencil_ref_builtin)
					return "";
				if (!msl_options.supports_msl_version(2, 1))
					SPIRV_CROSS_THROW("Stencil export only supported in MSL 2.1 and up.");
				return string(" [[") + builtin_qualifier(builtin) + "]]";

			case BuiltInFragDepth:
				// Ditto FragDepth.
				if (!msl_options.enable_frag_depth_builtin)
					return "";
				/* fallthrough */
			case BuiltInSampleMask:
				return string(" [[") + builtin_qualifier(builtin) + "]]";

			default:
				return "";
			}
		}
		uint32_t locn = get_member_location(type.self, index);
		// Metal will likely complain about missing color attachments, too.
		if (locn != k_unknown_location && !(msl_options.enable_frag_output_mask & (1 << locn)))
			return "";
		if (locn != k_unknown_location && has_member_decoration(type.self, index, DecorationIndex))
			return join(" [[color(", locn, "), index(", get_member_decoration(type.self, index, DecorationIndex),
			            ")]]");
		else if (locn != k_unknown_location)
			return join(" [[color(", locn, ")]]");
		else if (has_member_decoration(type.self, index, DecorationIndex))
			return join(" [[index(", get_member_decoration(type.self, index, DecorationIndex), ")]]");
		else
			return "";
	}

	// Compute function inputs
	if (execution.model == ExecutionModelGLCompute && type.storage == StorageClassInput)
	{
		if (is_builtin)
		{
			switch (builtin)
			{
			case BuiltInNumSubgroups:
			case BuiltInSubgroupId:
			case BuiltInSubgroupLocalInvocationId: // FIXME: Should work in any stage
			case BuiltInSubgroupSize: // FIXME: Should work in any stage
				if (msl_options.emulate_subgroups)
					break;
				/* fallthrough */
			case BuiltInGlobalInvocationId:
			case BuiltInWorkgroupId:
			case BuiltInNumWorkgroups:
			case BuiltInLocalInvocationId:
			case BuiltInLocalInvocationIndex:
				return string(" [[") + builtin_qualifier(builtin) + "]]";

			default:
				return "";
			}
		}
	}

	return "";
}